

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>::
PerformDefaultAction
          (Result *__return_storage_ptr__,
          FunctionMocker<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>
          *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Action<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)> *this_00;
  OnCallSpec<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string message;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  ArgumentTuple local_40;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>
                 *)0x0;
      break;
    }
    this_01 = (OnCallSpec<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>
               *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>::
            Matches(this_01,args);
  } while (!bVar2);
  if (this_01 ==
      (OnCallSpec<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)> *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_60);
    if (DefaultValue<ot::commissioner::Error>::producer_ == (long *)0x0) {
      __return_storage_ptr__->mCode = kNone;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      (__return_storage_ptr__->mMessage)._M_string_length = 0;
      (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
    }
    else {
      (**(code **)(*DefaultValue<ot::commissioner::Error>::producer_ + 0x10))
                (__return_storage_ptr__);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
  }
  else {
    this_00 = OnCallSpec<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>::
              GetAction(this_01);
    local_40.super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>.
    super__Tuple_impl<1UL,_unsigned_short>.super__Head_base<1UL,_unsigned_short,_false>._M_head_impl
         = (_Head_base<1UL,_unsigned_short,_false>)
           (args->super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>).
           super__Tuple_impl<1UL,_unsigned_short>.super__Head_base<1UL,_unsigned_short,_false>.
           _M_head_impl;
    local_40.super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>.
    super__Head_base<0UL,_ot::commissioner::BbrDataset_&,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_ot::commissioner::BbrDataset_&,_unsigned_short>).
         super__Head_base<0UL,_ot::commissioner::BbrDataset_&,_false>._M_head_impl;
    Action<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>::Perform
              (__return_storage_ptr__,this_00,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }